

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<char,_int>_>::print_subgraph
          (NFABase<Centaurus::NFABaseState<char,_int>_> *this,wostream *os,int index,wstring *prefix
          )

{
  uint uVar1;
  wostream *pwVar2;
  pointer pNVar3;
  pointer pNVar4;
  
  pwVar2 = std::operator<<(os,L"subgraph cluster_");
  pwVar2 = std::operator<<(pwVar2,(wstring *)prefix);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"label=\"[");
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,index);
  pwVar2 = std::operator<<(pwVar2,L"]\"");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  uVar1 = 0;
  while( true ) {
    pNVar4 = (this->m_states).
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar3 = (this->m_states).
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pNVar3 - (long)pNVar4) / 0x28) <= (ulong)uVar1) break;
    pwVar2 = std::operator<<(os,(wstring *)prefix);
    pwVar2 = std::operator<<(pwVar2,L"_S");
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    std::operator<<(pwVar2,L" [ label=\"");
    (*this->_vptr_NFABase[2])(this,os,(ulong)uVar1);
    pwVar2 = std::operator<<(os,L"\", shape=circle ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    uVar1 = uVar1 + 1;
  }
  for (uVar1 = 0; (ulong)uVar1 < (ulong)(((long)pNVar3 - (long)pNVar4) / 0x28); uVar1 = uVar1 + 1) {
    NFABaseState<char,_int>::print_subgraph(pNVar4 + uVar1,os,uVar1,prefix);
    pNVar4 = (this->m_states).
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar3 = (this->m_states).
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  return;
}

Assistant:

void print_subgraph(std::wostream& os, int index, const std::wstring& prefix) const
	{
		os << L"subgraph cluster_" << prefix << L" {" << std::endl;
		os << L"label=\"[" << index << L"]\"" << std::endl;
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << prefix << L"_S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print_subgraph(os, i, prefix);
		}
		os << L"}" << std::endl;
	}